

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * parse_asm_declarator(dmr_C *C,token *token,decl_state *ctx)

{
  token *ptVar1;
  expression *local_28;
  expression *expr;
  decl_state *ctx_local;
  token *token_local;
  dmr_C *C_local;
  
  expr = (expression *)ctx;
  ctx_local = (decl_state *)token;
  token_local = (token *)C;
  ctx_local = (decl_state *)dmrC_expect_token(C,token,0x28,"after asm");
  ctx_local = (decl_state *)
              dmrC_parse_expression
                        ((dmr_C *)token_local,(token *)(ctx_local->ctype).alignment,&local_28);
  ptVar1 = dmrC_expect_token((dmr_C *)token_local,(token *)ctx_local,0x29,"after asm");
  return ptVar1;
}

Assistant:

static struct token *parse_asm_declarator(struct dmr_C *C, struct token *token, struct decl_state *ctx)
{
        (void) ctx;
	struct expression *expr;
	token = dmrC_expect_token(C, token, '(', "after asm");
	token = dmrC_parse_expression(C, token->next, &expr);
	token = dmrC_expect_token(C, token, ')', "after asm");
	return token;
}